

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

void __thiscall boundingBoxTy::enlarge_pos(boundingBoxTy *this,double lat,double lon)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  positionTy *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double diffE;
  double diffW;
  double in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  positionTy local_60;
  double local_18;
  double local_10;
  
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  pdVar3 = positionTy::lon(in_RDI);
  uVar2 = std::isnan(*pdVar3);
  dVar4 = local_10;
  if ((uVar2 & 1) == 0) {
    pdVar3 = positionTy::lat(in_RDI + 1);
    dVar5 = local_10;
    if (*pdVar3 <= dVar4) {
      pdVar3 = positionTy::lat(in_RDI);
      if (*pdVar3 <= dVar5 && dVar5 != *pdVar3) {
        pdVar3 = positionTy::lat(in_RDI);
        *pdVar3 = local_10;
      }
    }
    else {
      pdVar3 = positionTy::lat(in_RDI + 1);
      *pdVar3 = local_10;
    }
    positionTy::lon(in_RDI);
    dVar4 = HeadingDiff(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    positionTy::lon(in_RDI + 1);
    dVar5 = HeadingDiff(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    bVar1 = dequal(dVar4,dVar5);
    if (bVar1) {
      if (0.0 <= dVar4) {
        pdVar3 = positionTy::lon(in_RDI + 1);
        *pdVar3 = local_18;
      }
      else {
        pdVar3 = positionTy::lon(in_RDI);
        *pdVar3 = local_18;
      }
    }
    else if ((dVar4 <= 0.0) || (0.0 <= dVar5)) {
      if (ABS(dVar5) <= ABS(dVar4)) {
        pdVar3 = positionTy::lon(in_RDI + 1);
        *pdVar3 = local_18;
      }
      else {
        pdVar3 = positionTy::lon(in_RDI);
        *pdVar3 = local_18;
      }
    }
  }
  else {
    positionTy::positionTy
              (&local_60,local_10,local_18,NAN,NAN,NAN,NAN,NAN,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,
               FPH_UNKNOWN);
    memcpy(in_RDI + 1,&local_60,0x48);
    memcpy(in_RDI,in_RDI + 1,0x48);
  }
  return;
}

Assistant:

void boundingBoxTy::enlarge_pos (double lat, double lon)
{
    // in the special case that the bounding box isn't initialized
    // we make it the size of this point:
    if (std::isnan(nw.lon())) {
        nw = se = positionTy(lat,lon);
        return;
    }
    
    // Latitude is easy as it must be between -90 and 90 degrees
    if (lat < se.lat())
        se.lat() = lat;
    else if (lat > nw.lat())
        nw.lat() = lat;
    
    // Longitude is more complex, the bounding box can be enlarged
    // both to the east or to the west to include lPos.
    // Which way to go? We go the way with the shorter added angle
    const double diffW = HeadingDiff(nw.lon(), lon);
    const double diffE = HeadingDiff(se.lon(), lon);
    
    // There are 2 special cases:
    // 1. The longitude is already included in the bounding box if diffW points east _and_ diffE points west,
    // 2. The bounding box is a single point
    if (dequal(diffW, diffE)) {
        if (diffW < 0.0)                    // extend west-ward
            nw.lon() = lon;
        else                                // else east-ward
            se.lon() = lon;
    }
    // in all other cases we change the edge which requires least change:
    else if (diffW <= 0.0 || diffE >= 0.0)
    {
        if (fabs(diffW) < fabs(diffE))
            nw.lon() = lon;
        else
            se.lon() = lon;
    }
}